

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromDigits
                (bitwidth_t bits,LiteralBase base,bool isSigned,bool anyUnknown,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  format_args args;
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  bool bVar1;
  ulong uVar2;
  invalid_argument *piVar3;
  size_type sVar4;
  reference peVar5;
  byte in_CL;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  uint in_ESI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  byte in_R8B;
  SVInt SVar7;
  undefined1 in_stack_00000030 [16];
  logic_t *d;
  iterator __end2;
  iterator __begin2;
  span<const_slang::logic_t,_18446744073709551615UL> *__range2;
  uint64_t val;
  uint32_t shift;
  uint32_t radix;
  undefined1 in_stack_000000e0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_000000e8;
  string_view in_stack_000000f0;
  span<const_slang::logic_t,_18446744073709551615UL> *in_stack_fffffffffffffe78;
  __normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
  *in_stack_fffffffffffffe80;
  span<const_slang::logic_t,_18446744073709551615UL> *in_stack_fffffffffffffe88;
  SVInt *in_stack_fffffffffffffe90;
  bool isSigned_00;
  bitwidth_t bitWidth;
  string local_108 [32];
  reference local_e8;
  logic_t *local_e0;
  __normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
  in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff38;
  uint local_b8 [4];
  byte local_a7;
  byte local_a6;
  byte local_a5;
  uint local_a4;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  bitwidth_t in_stack_ffffffffffffff74;
  uint local_88 [4];
  undefined8 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  uint *local_58;
  reference local_50;
  char *local_48;
  undefined8 uStack_40;
  string *local_38;
  uint8_t local_29;
  undefined1 *local_28;
  uint local_1c;
  uint *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_a6 = in_CL & 1;
  local_a7 = in_R8B & 1;
  local_a5 = in_DL;
  local_a4 = in_ESI;
  bVar1 = std::span<const_slang::logic_t,_18446744073709551615UL>::empty
                    ((span<const_slang::logic_t,_18446744073709551615UL> *)0x295455);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"No digits provided");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_b8[0] = 0;
  uVar2 = (ulong)local_a5;
  switch(uVar2) {
  case 0:
    local_b8[0] = 2;
    break;
  case 1:
    local_b8[0] = 8;
    break;
  case 2:
    local_b8[0] = 10;
    break;
  case 3:
    local_b8[0] = 0x10;
  }
  if ((local_a4 < 0x41) && ((local_a7 & 1) == 0)) {
    std::span<const_slang::logic_t,_18446744073709551615UL>::begin(in_stack_fffffffffffffe78);
    local_e0 = (logic_t *)
               std::span<const_slang::logic_t,_18446744073709551615UL>::end
                         (in_stack_fffffffffffffe88);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
                             (in_stack_fffffffffffffe80,
                              (__normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe78), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
                 ::operator*((__normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
                              *)&stack0xffffffffffffff28);
      if (local_b8[0] <= local_e8->value) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_38 = local_108;
        local_48 = "Digit {} too large for radix {}";
        uStack_40 = 0x1f;
        local_50 = local_e8;
        local_58 = local_b8;
        local_68 = "Digit {} too large for radix {}";
        uStack_60 = 0x1f;
        local_29 = local_e8->value;
        local_28 = &stack0xffffffffffffff68;
        local_18 = local_88;
        local_1c = local_b8[0];
        local_8 = &local_78;
        local_78 = 0x22;
        args.desc_._1_1_ = anyUnknown;
        args.desc_._0_1_ = in_stack_000000e0;
        args.desc_._2_1_ = isSigned;
        args.desc_._3_1_ = base;
        args.desc_._4_4_ = bits;
        args.field_1.args_ = in_stack_000000e8.args_;
        local_10 = local_28;
        local_88[0] = local_1c;
        local_70 = local_28;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_000000f0,args);
        std::invalid_argument::invalid_argument(piVar3,local_108);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      __gnu_cxx::
      __normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::logic_t_*,_std::span<const_slang::logic_t,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff28);
    }
    SVInt(in_stack_fffffffffffffe90,(bitwidth_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
          (uint64_t)in_stack_fffffffffffffe80,SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0));
    uVar6 = extraout_RDX;
  }
  else if (local_b8[0] == 10) {
    if ((local_a7 & 1) == 0) {
      digits_00._M_extent._M_extent_value = in_stack_ffffffffffffff38._M_extent_value;
      digits_00._M_ptr = in_stack_ffffffffffffff30;
      SVar7 = fromDecimalDigits((bitwidth_t)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20),
                                SUB81((ulong)in_stack_ffffffffffffff28._M_current >> 0x18,0),
                                digits_00);
      uVar6 = SVar7.super_SVIntStorage._8_8_;
    }
    else {
      sVar4 = std::span<const_slang::logic_t,_18446744073709551615UL>::size
                        ((span<const_slang::logic_t,_18446744073709551615UL> *)0x295889);
      if (sVar4 != 1) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar3,"If a decimal number is unknown, it must have exactly one digit.");
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      peVar5 = std::span<const_slang::logic_t,_18446744073709551615UL>::operator[]
                         ((span<const_slang::logic_t,_18446744073709551615UL> *)&stack0x00000008,0);
      bVar1 = exactlyEqual((logic_t)peVar5->value,(logic_t)0x40);
      isSigned_00 = SUB81(uVar2 >> 0x18,0);
      bitWidth = (bitwidth_t)(uVar2 >> 0x20);
      if (bVar1) {
        SVar7 = createFillZ(bitWidth,isSigned_00);
        uVar6 = SVar7.super_SVIntStorage._8_8_;
      }
      else {
        SVar7 = createFillX(bitWidth,isSigned_00);
        uVar6 = SVar7.super_SVIntStorage._8_8_;
      }
    }
  }
  else {
    SVar7 = fromPow2Digits(in_stack_ffffffffffffff74,(bool)in_stack_ffffffffffffff73,
                           (bool)in_stack_ffffffffffffff72,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff68,
                           (span<const_slang::logic_t,_18446744073709551615UL>)in_stack_00000030);
    uVar6 = SVar7.super_SVIntStorage._8_8_;
  }
  SVar7.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar7.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDigits(bitwidth_t bits, LiteralBase base, bool isSigned, bool anyUnknown,
                        std::span<logic_t const> digits) {
    if (digits.empty())
        SLANG_THROW(std::invalid_argument("No digits provided"));

    // Note: If the user specified a number too large to fit in the number of bits specified,
    // the spec says to truncate from the left, which this method will successfully do.

    uint32_t radix = 0;
    uint32_t shift = 0;
    switch (base) {
        case LiteralBase::Binary:
            radix = 2;
            shift = 1;
            break;
        case LiteralBase::Octal:
            radix = 8;
            shift = 3;
            break;
        case LiteralBase::Decimal:
            radix = 10;
            shift = 0; // can't actually shift for Decimal numbers
            break;
        case LiteralBase::Hex:
            radix = 16;
            shift = 4;
            break;
    }

    if (bits <= BITS_PER_WORD && !anyUnknown) {
        // Fast path for values that fit in one word:
        // let's do the computation entirely in a normal uint64_t instead
        // of having to do SVInt operations
        uint64_t val = 0;
        for (const logic_t& d : digits) {
            if (shift)
                val <<= shift;
            else
                val *= radix;

            val += d.value;
            if (d.value >= radix) {
                SLANG_THROW(std::invalid_argument(
                    fmt::format("Digit {} too large for radix {}", d.value, radix)));
            }
        }
        return SVInt(bits, val, isSigned);
    }

    if (radix == 10) {
        // In base ten we can't have individual bits be X or Z, it's all or nothing
        if (anyUnknown) {
            if (digits.size() != 1) {
                SLANG_THROW(std::invalid_argument(
                    "If a decimal number is unknown, it must have exactly one digit."));
            }

            if (exactlyEqual(digits[0], logic_t::z))
                return createFillZ(bits, isSigned);
            else
                return createFillX(bits, isSigned);
        }

        return fromDecimalDigits(bits, isSigned, digits);
    }

    return fromPow2Digits(bits, isSigned, anyUnknown, radix, shift, digits);
}